

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# loadlib.c
# Opt level: O3

int gctm(lua_State *L)

{
  bool bVar1;
  ulong n;
  
  n = luaL_len(L,1);
  if (0 < (long)n) {
    do {
      lua_rawgeti(L,1,n);
      lua_touserdata(L,-1);
      lua_settop(L,-2);
      bVar1 = 1 < n;
      n = n - 1;
    } while (bVar1);
  }
  return 0;
}

Assistant:

static int gctm(lua_State *L) {
    lua_Integer n = luaL_len(L, 1);
    for (; n >= 1; n--) {  /* for each handle, in reverse order */
        lua_rawgeti(L, 1, n);  /* get handle CLIBS[n] */
        lsys_unloadlib(lua_touserdata(L, -1));
        lua_pop(L, 1);  /* pop handle */
    }
    return 0;
}